

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeTriggerProgram(Parse *pParse,TriggerStep *pStepList,int orconf)

{
  char cVar1;
  long lVar2;
  sqlite3 *db_00;
  int in_EDX;
  char *in_RSI;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  Expr *in_stack_00000028;
  ExprList *in_stack_00000030;
  Expr *in_stack_00000038;
  SrcList *in_stack_00000040;
  Parse *in_stack_00000048;
  Select *pSelect;
  sqlite3 *db;
  Vdbe *v;
  TriggerStep *pStep;
  undefined4 in_stack_000000a0;
  SelectDest sDest;
  Expr *in_stack_000000e0;
  ExprList *in_stack_000000e8;
  SrcList *in_stack_000000f0;
  Parse *in_stack_000000f8;
  Expr *in_stack_00000190;
  Upsert *in_stack_00000198;
  SelectDest *in_stack_000001b0;
  Select *in_stack_000001b8;
  Parse *in_stack_000001c0;
  Select *in_stack_ffffffffffffff18;
  sqlite3 *in_stack_ffffffffffffff20;
  int flags;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  sqlite3 *in_stack_ffffffffffffff30;
  sqlite3 *in_stack_ffffffffffffff38;
  sqlite3 *in_stack_ffffffffffffff40;
  sqlite3 *in_stack_ffffffffffffff48;
  sqlite3 *in_stack_ffffffffffffff50;
  IdList *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  sqlite3 *in_stack_ffffffffffffff68;
  u8 local_6c;
  char *local_50;
  undefined1 local_30 [16];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = (sqlite3 *)in_RDI->pVfs;
  for (local_50 = in_RSI; local_50 != (char *)0x0; local_50 = *(char **)(local_50 + 0x50)) {
    if (in_EDX == 0xb) {
      local_6c = local_50[1];
    }
    else {
      local_6c = (u8)in_EDX;
    }
    *(u8 *)&in_RDI->nExtension = local_6c;
    if (*(long *)(local_50 + 0x48) != 0) {
      sqlite3MPrintf(db_00,"-- %s",*(undefined8 *)(local_50 + 0x48));
      in_stack_ffffffffffffff18 =
           (Select *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xfffffffa);
      sqlite3VdbeAddOp4((Vdbe *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                        in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                        (int)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
                        (int)in_stack_ffffffffffffff40);
    }
    cVar1 = *local_50;
    if (cVar1 == -0x80) {
      in_stack_ffffffffffffff40 = in_RDI;
      in_stack_ffffffffffffff48 =
           (sqlite3 *)
           sqlite3TriggerStepSrc
                     ((Parse *)in_stack_ffffffffffffff68,
                      (TriggerStep *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      in_stack_ffffffffffffff50 =
           (sqlite3 *)
           sqlite3SelectDup(in_stack_ffffffffffffff50,(Select *)in_stack_ffffffffffffff48,
                            (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      in_stack_ffffffffffffff58 =
           sqlite3IdListDup(in_stack_ffffffffffffff38,(IdList *)in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff64 = (uint)(byte)in_RDI->nExtension;
      sqlite3UpsertDup(in_stack_ffffffffffffff48,(Upsert *)in_stack_ffffffffffffff40);
      sqlite3Insert((Parse *)sDest._16_8_,(SrcList *)sDest._8_8_,(Select *)sDest._0_8_,
                    (IdList *)pParse,pStepList._4_4_,(Upsert *)CONCAT44(orconf,in_stack_000000a0));
      sqlite3VdbeAddOp0((Vdbe *)in_stack_ffffffffffffff20,
                        (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    else if (cVar1 == -0x7f) {
      in_stack_ffffffffffffff30 = in_RDI;
      in_stack_ffffffffffffff38 =
           (sqlite3 *)
           sqlite3TriggerStepSrc
                     ((Parse *)in_stack_ffffffffffffff68,
                      (TriggerStep *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      sqlite3ExprDup(in_stack_ffffffffffffff30,
                     (Expr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      sqlite3DeleteFrom(in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030,
                        in_stack_00000028);
      sqlite3VdbeAddOp0((Vdbe *)in_stack_ffffffffffffff20,
                        (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    else if (cVar1 == -0x7e) {
      in_stack_ffffffffffffff68 = in_RDI;
      sqlite3TriggerStepSrc
                ((Parse *)in_RDI,
                 (TriggerStep *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      flags = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
      sqlite3ExprListDup(in_stack_ffffffffffffff68,
                         (ExprList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      sqlite3ExprDup(in_stack_ffffffffffffff30,
                     (Expr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),flags);
      in_stack_ffffffffffffff18 = (Select *)0x0;
      in_stack_ffffffffffffff20 = (sqlite3 *)0x0;
      sqlite3Update(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                    sDest.pOrderBy._4_4_,(ExprList *)sDest.zAffSdst,in_stack_00000190,
                    in_stack_00000198);
      sqlite3VdbeAddOp0((Vdbe *)in_stack_ffffffffffffff20,
                        (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    else {
      memset(local_30,0xaa,0x28);
      sqlite3SelectDup(in_stack_ffffffffffffff50,(Select *)in_stack_ffffffffffffff48,
                       (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      sqlite3SelectDestInit((SelectDest *)local_30,4,0);
      sqlite3Select(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
      sqlite3SelectDelete(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

static int codeTriggerProgram(
  Parse *pParse,            /* The parser context */
  TriggerStep *pStepList,   /* List of statements inside the trigger body */
  int orconf                /* Conflict algorithm. (OE_Abort, etc) */
){
  TriggerStep *pStep;
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;

  assert( pParse->pTriggerTab && pParse->pToplevel );
  assert( pStepList );
  assert( v!=0 );
  for(pStep=pStepList; pStep; pStep=pStep->pNext){
    /* Figure out the ON CONFLICT policy that will be used for this step
    ** of the trigger program. If the statement that caused this trigger
    ** to fire had an explicit ON CONFLICT, then use it. Otherwise, use
    ** the ON CONFLICT policy that was specified as part of the trigger
    ** step statement. Example:
    **
    **   CREATE TRIGGER AFTER INSERT ON t1 BEGIN;
    **     INSERT OR REPLACE INTO t2 VALUES(new.a, new.b);
    **   END;
    **
    **   INSERT INTO t1 ... ;            -- insert into t2 uses REPLACE policy
    **   INSERT OR IGNORE INTO t1 ... ;  -- insert into t2 uses IGNORE policy
    */
    pParse->eOrconf = (orconf==OE_Default)?pStep->orconf:(u8)orconf;
    assert( pParse->okConstFactor==0 );

#ifndef SQLITE_OMIT_TRACE
    if( pStep->zSpan ){
      sqlite3VdbeAddOp4(v, OP_Trace, 0x7fffffff, 1, 0,
                        sqlite3MPrintf(db, "-- %s", pStep->zSpan),
                        P4_DYNAMIC);
    }
#endif

    switch( pStep->op ){
      case TK_UPDATE: {
        sqlite3Update(pParse,
          sqlite3TriggerStepSrc(pParse, pStep),
          sqlite3ExprListDup(db, pStep->pExprList, 0),
          sqlite3ExprDup(db, pStep->pWhere, 0),
          pParse->eOrconf, 0, 0, 0
        );
        sqlite3VdbeAddOp0(v, OP_ResetCount);
        break;
      }
      case TK_INSERT: {
        sqlite3Insert(pParse,
          sqlite3TriggerStepSrc(pParse, pStep),
          sqlite3SelectDup(db, pStep->pSelect, 0),
          sqlite3IdListDup(db, pStep->pIdList),
          pParse->eOrconf,
          sqlite3UpsertDup(db, pStep->pUpsert)
        );
        sqlite3VdbeAddOp0(v, OP_ResetCount);
        break;
      }
      case TK_DELETE: {
        sqlite3DeleteFrom(pParse,
          sqlite3TriggerStepSrc(pParse, pStep),
          sqlite3ExprDup(db, pStep->pWhere, 0), 0, 0
        );
        sqlite3VdbeAddOp0(v, OP_ResetCount);
        break;
      }
      default: assert( pStep->op==TK_SELECT ); {
        SelectDest sDest;
        Select *pSelect = sqlite3SelectDup(db, pStep->pSelect, 0);
        sqlite3SelectDestInit(&sDest, SRT_Discard, 0);
        sqlite3Select(pParse, pSelect, &sDest);
        sqlite3SelectDelete(db, pSelect);
        break;
      }
    }
  }

  return 0;
}